

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp_plane_avx2.c
# Opt level: O0

void av1_warp_affine_avx2
               (int32_t *mat,uint8_t *ref,int width,int height,int stride,uint8_t *pred,int p_col,
               int p_row,int p_width,int p_height,int p_stride,int subsampling_x,int subsampling_y,
               ConvolveParams *conv_params,int16_t alpha,int16_t beta,int16_t gamma,int16_t delta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  __m256i src_02;
  __m256i src_03;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  ushort uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int in_ECX;
  uint uVar18;
  long lVar19;
  int in_EDX;
  uint uVar20;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  int in_stack_00000008;
  undefined4 in_stack_00000044;
  __m256i coeff [4];
  __m256i src_01;
  __m128i shuffle_reg_right_1;
  __m128i shuffle_reg_left_1;
  __m128i src;
  __m256i src_01_1;
  __m128i shuffle_reg_right;
  __m128i shuffle_reg_left;
  __m128i src1;
  __m128i src0;
  int row_2;
  int sx;
  int iy_2;
  int out_of_boundary_right;
  int out_of_boundary_left;
  __m256i temp_1_1;
  __m256i temp_0_1;
  int row_1;
  int iy_1;
  __m256i temp_1;
  __m256i temp_0;
  int row;
  int iy;
  int32_t sy4;
  int32_t iy4;
  int32_t sx4;
  int32_t ix4;
  int64_t y4;
  int64_t x4;
  int64_t dst_y;
  int64_t dst_x;
  int32_t src_y;
  int32_t src_x;
  __m256i shuffle_src [4];
  int16_t const5;
  int16_t const4;
  int32_t const3;
  int32_t const2;
  int32_t const1;
  __m256i res_add_const_1;
  __m256i wt;
  __m256i round_bits_const;
  __m256i res_sub_const;
  __m128i shift;
  __m256i round_const;
  int offset_bits;
  int round_bits;
  __m256i res_add_const;
  __m256i reduce_bits_vert_const;
  int offset_bits_vert;
  int offset_bits_horiz;
  int reduce_bits_vert;
  int reduce_bits_horiz;
  int bd;
  int k;
  int j;
  int i;
  __m256i horz_out [8];
  int in_stack_fffffffffffff550;
  undefined4 in_stack_fffffffffffff554;
  undefined1 *in_stack_fffffffffffff580;
  __m256i *in_stack_fffffffffffff588;
  uint8_t *in_stack_fffffffffffff590;
  __m256i *in_stack_fffffffffffff5a8;
  undefined4 in_stack_fffffffffffff5b0;
  int iVar25;
  undefined4 in_stack_fffffffffffff5b4;
  undefined2 in_stack_fffffffffffff5b8;
  ushort in_stack_fffffffffffff5ba;
  int in_stack_fffffffffffff5bc;
  ushort uVar26;
  int in_stack_fffffffffffff5c0;
  int in_stack_fffffffffffff5c4;
  int in_stack_fffffffffffff5c8;
  undefined2 in_stack_fffffffffffff5cc;
  ushort in_stack_fffffffffffff5ce;
  int in_stack_fffffffffffff5d0;
  ushort in_stack_fffffffffffff5d4;
  ushort in_stack_fffffffffffff5d6;
  int in_stack_fffffffffffff5d8;
  int in_stack_fffffffffffff5dc;
  int in_stack_fffffffffffff5e0;
  int in_stack_fffffffffffff5e4;
  uint in_stack_fffffffffffff5e8;
  undefined4 uVar27;
  undefined2 in_stack_fffffffffffff5f8;
  __m256i *in_stack_fffffffffffff600;
  int in_stack_fffffffffffff628;
  int in_stack_fffffffffffff630;
  int in_stack_fffffffffffff638;
  int in_stack_fffffffffffff640;
  int in_stack_fffffffffffff648;
  int in_stack_fffffffffffff650;
  __m256i *in_stack_fffffffffffff658;
  int in_stack_fffffffffffff660;
  __m256i *in_stack_fffffffffffff668;
  __m256i *in_stack_fffffffffffff670;
  __m256i *in_stack_fffffffffffff678;
  int in_stack_fffffffffffff6ac;
  __m128i *in_stack_fffffffffffff6b0;
  __m256i *in_stack_fffffffffffff6b8;
  __m256i *in_stack_fffffffffffff6c0;
  __m256i *in_stack_fffffffffffff6c8;
  __m256i *palVar28;
  __m256i *horz_out_00;
  longlong lVar29;
  longlong lVar30;
  undefined1 in_stack_fffffffffffff6e0 [24];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  int local_848;
  int local_800;
  uint8_t local_7c0 [8];
  uint8_t auStack_7b8 [8];
  uint8_t auStack_7b0 [8];
  uint8_t auStack_7a8 [8];
  uint8_t local_7a0 [8];
  uint8_t auStack_798 [8];
  uint8_t auStack_790 [8];
  uint8_t auStack_788 [8];
  uint8_t local_780 [8];
  uint8_t auStack_778 [8];
  uint8_t auStack_770 [8];
  uint8_t auStack_768 [8];
  uint8_t local_760 [8];
  uint8_t auStack_758 [8];
  uint8_t auStack_750 [8];
  uint8_t auStack_748 [24];
  short local_730;
  short local_72e;
  undefined4 local_72c;
  int local_728;
  int local_724;
  undefined1 local_720 [32];
  uint8_t local_700 [32];
  longlong local_6e0 [4];
  undefined1 local_6c0 [48];
  ulong local_690 [3];
  longlong lStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  int local_648;
  int local_644;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  int local_600;
  undefined4 local_5fc;
  int local_5f8;
  uint local_5f4;
  undefined4 local_5f0;
  int local_5ec;
  int local_5e8;
  int local_5e4;
  undefined8 local_5e0 [36];
  int local_4bc;
  int local_4b8;
  int local_4b4;
  long local_4b0;
  int *local_4a8;
  uint local_49c;
  uint local_498;
  uint local_494;
  ushort local_48e;
  ushort local_48c;
  ushort local_48a;
  ushort local_488;
  ushort local_486;
  ushort local_484;
  ushort local_482;
  undefined1 local_480 [16];
  uint local_464;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  uint8_t *local_418;
  uint8_t *local_410;
  uint8_t *local_408;
  uint8_t *local_400;
  uint8_t (*local_3f8) [16];
  uint8_t (*local_3f0) [16];
  undefined1 (*local_3e8) [16];
  uint8_t (*local_3e0) [16];
  uint8_t (*local_3d8) [16];
  undefined1 (*local_3d0) [16];
  undefined1 (*local_3c8) [16];
  __m128i *local_3c0;
  __m256i *palStack_3b8;
  __m256i *local_3b0;
  longlong lStack_3a8;
  __m256i *local_3a0;
  __m256i *palStack_398;
  __m256i *local_390;
  longlong lStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  __m256i *local_300;
  longlong lStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [16];
  undefined1 auStack_2d0 [16];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [16];
  undefined1 auStack_290 [16];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [16];
  undefined1 auStack_210 [16];
  ushort local_200;
  ushort local_1fe;
  ushort local_1fc;
  ushort local_1fa;
  ushort local_1f8;
  ushort local_1f6;
  ushort local_1f4;
  ushort local_1f2;
  ushort local_1f0;
  ushort local_1ee;
  ushort local_1ec;
  ushort local_1ea;
  ushort local_1e8;
  ushort local_1e6;
  ushort local_1e4;
  ushort local_1e2;
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  ushort local_1c0;
  ushort local_1be;
  ushort local_1bc;
  ushort local_1ba;
  ushort local_1b8;
  ushort local_1b6;
  ushort local_1b4;
  ushort local_1b2;
  ushort local_1b0;
  ushort local_1ae;
  ushort local_1ac;
  ushort local_1aa;
  ushort local_1a8;
  ushort local_1a6;
  ushort local_1a4;
  ushort local_1a2;
  undefined1 local_1a0 [16];
  undefined1 auStack_190 [16];
  ushort local_180;
  ushort local_17e;
  ushort local_17c;
  ushort local_17a;
  ushort local_178;
  ushort local_176;
  ushort local_174;
  ushort local_172;
  ushort local_170;
  ushort local_16e;
  ushort local_16c;
  ushort local_16a;
  ushort local_168;
  ushort local_166;
  ushort local_164;
  ushort local_162;
  undefined1 local_160 [32];
  ushort local_140;
  ushort local_13e;
  ushort local_13c;
  ushort local_13a;
  ushort local_138;
  ushort local_136;
  ushort local_134;
  ushort local_132;
  ushort local_130;
  ushort local_12e;
  ushort local_12c;
  ushort local_12a;
  ushort local_128;
  ushort local_126;
  ushort local_124;
  ushort local_122;
  undefined1 local_120 [16];
  undefined1 auStack_110 [16];
  ushort local_100;
  ushort local_fe;
  ushort local_fc;
  ushort local_fa;
  ushort local_f8;
  ushort local_f6;
  ushort local_f4;
  ushort local_f2;
  ushort local_f0;
  ushort local_ee;
  ushort local_ec;
  ushort local_ea;
  ushort local_e8;
  ushort local_e6;
  ushort local_e4;
  ushort local_e2;
  undefined1 local_e0 [16];
  undefined1 auStack_d0 [16];
  ushort local_c0;
  ushort local_be;
  ushort local_bc;
  ushort local_ba;
  ushort local_b8;
  ushort local_b6;
  ushort local_b4;
  ushort local_b2;
  ushort local_b0;
  ushort local_ae;
  ushort local_ac;
  ushort local_aa;
  ushort local_a8;
  ushort local_a6;
  ushort local_a4;
  ushort local_a2;
  undefined1 local_a0 [32];
  ushort local_78;
  ushort local_76;
  ushort local_74;
  ushort local_72;
  ushort local_70;
  ushort local_6e;
  ushort local_6c;
  ushort local_6a;
  ushort local_68;
  ushort local_66;
  ushort local_64;
  ushort local_62;
  ushort local_60;
  ushort local_5e;
  ushort local_5c;
  ushort local_5a;
  
  local_5f0 = 8;
  local_5f4 = *(uint *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x14);
  if (*(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x20) == 0) {
    iVar13 = 0xe - local_5f4;
  }
  else {
    iVar13 = *(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x18);
  }
  local_5fc = 0xe;
  uVar27 = 0x16;
  local_600 = 0x16 - local_5f4;
  local_5f8._0_1_ = (byte)iVar13;
  uVar18 = (1 << ((byte)local_5f8 & 0x1f)) >> 1;
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  local_2e0 = vpinsrd_avx(auVar1,uVar18,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar18),uVar18,1);
  auVar1 = vpinsrd_avx(auVar1,uVar18,2);
  auStack_2d0 = vpinsrd_avx(auVar1,uVar18,3);
  local_620 = local_2e0._0_8_;
  uStack_618 = local_2e0._8_8_;
  uStack_610 = auStack_2d0._0_8_;
  uStack_608 = auStack_2d0._8_8_;
  uVar20 = 1 << ((byte)local_600 & 0x1f);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  local_2a0 = vpinsrd_avx(auVar1,uVar20,3);
  auVar1 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar1 = vpinsrd_avx(auVar1,uVar20,2);
  auStack_290 = vpinsrd_avx(auVar1,uVar20,3);
  local_640 = local_2a0._0_8_;
  uStack_638 = local_2a0._8_8_;
  uStack_630 = auStack_290._0_8_;
  uStack_628 = auStack_290._8_8_;
  local_644 = 0xe - (*(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x14) +
                    *(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x18));
  local_648 = 0x16 - *(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x14);
  uVar12 = (short)((uint)(1 << ((byte)local_5f4 & 0x1f)) >> 1) + 0x4000;
  auVar1 = vpinsrw_avx(ZEXT216(uVar12),(uint)uVar12,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,6);
  local_220 = vpinsrw_avx(auVar1,(uint)uVar12,7);
  auVar1 = vpinsrw_avx(ZEXT216(uVar12),(uint)uVar12,1);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,2);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,3);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,4);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,5);
  auVar1 = vpinsrw_avx(auVar1,(uint)uVar12,6);
  auStack_210 = vpinsrw_avx(auVar1,(uint)uVar12,7);
  local_690[2] = local_220._0_8_;
  lStack_678 = local_220._8_8_;
  uStack_670 = auStack_210._0_8_;
  uStack_668 = auStack_210._8_8_;
  local_480._4_4_ = 0;
  local_480._0_4_ = local_5f4;
  local_690[0] = local_480._0_8_;
  local_690[1] = 0;
  local_5f8 = iVar13;
  local_4bc = in_R8D;
  local_4b8 = in_ECX;
  local_4b4 = in_EDX;
  local_4b0 = in_RSI;
  local_4a8 = in_RDI;
  local_498 = uVar20;
  local_494 = uVar18;
  local_482 = uVar12;
  local_480 = ZEXT416(local_5f4);
  local_464 = local_5f4;
  local_2c0 = uVar18;
  local_2bc = uVar18;
  local_2b8 = uVar18;
  local_2b4 = uVar18;
  local_2b0 = uVar18;
  local_2ac = uVar18;
  local_2a8 = uVar18;
  local_2a4 = uVar18;
  local_280 = uVar20;
  local_27c = uVar20;
  local_278 = uVar20;
  local_274 = uVar20;
  local_270 = uVar20;
  local_26c = uVar20;
  local_268 = uVar20;
  local_264 = uVar20;
  local_200 = uVar12;
  local_1fe = uVar12;
  local_1fc = uVar12;
  local_1fa = uVar12;
  local_1f8 = uVar12;
  local_1f6 = uVar12;
  local_1f4 = uVar12;
  local_1f2 = uVar12;
  local_1f0 = uVar12;
  local_1ee = uVar12;
  local_1ec = uVar12;
  local_1ea = uVar12;
  local_1e8 = uVar12;
  local_1e6 = uVar12;
  local_1e4 = uVar12;
  local_1e2 = uVar12;
  unpack_weights_and_set_round_const_avx2
            ((ConvolveParams *)
             CONCAT26(in_stack_fffffffffffff5ce,
                      CONCAT24(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8)),
             in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0,
             (__m256i *)
             CONCAT44(in_stack_fffffffffffff5bc,
                      CONCAT22(in_stack_fffffffffffff5ba,in_stack_fffffffffffff5b8)),
             (__m256i *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
             in_stack_fffffffffffff5a8);
  if (*(int *)(CONCAT44(in_stack_00000044,subsampling_y) + 0x20) == 1) {
    local_440 = local_620;
    uStack_438 = uStack_618;
    uStack_430 = uStack_610;
    uStack_428 = uStack_608;
    local_460 = local_640;
    uStack_458 = uStack_638;
    uStack_450 = uStack_630;
    uStack_448 = uStack_628;
    auVar10._8_8_ = uStack_618;
    auVar10._0_8_ = local_620;
    auVar10._16_8_ = uStack_610;
    auVar10._24_8_ = uStack_608;
    auVar9._8_8_ = uStack_638;
    auVar9._0_8_ = local_640;
    auVar9._16_8_ = uStack_630;
    auVar9._24_8_ = uStack_628;
    local_720 = vpaddd_avx2(auVar10,auVar9);
  }
  else {
    in_stack_fffffffffffff5e0 = CONCAT13((byte)local_5f8,(int3)in_stack_fffffffffffff5e0);
    in_stack_fffffffffffff5e4 = 1 << ((byte)local_5f8 + 7 & 0x1f);
    in_stack_fffffffffffff5e8 = ((1 << ((byte)local_5f8 & 0x1f)) >> 1) - in_stack_fffffffffffff5e4;
    auVar1 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff5e8),in_stack_fffffffffffff5e8,1);
    auVar1 = vpinsrd_avx(auVar1,in_stack_fffffffffffff5e8,2);
    auVar1 = vpinsrd_avx(auVar1,in_stack_fffffffffffff5e8,3);
    auVar2 = vpinsrd_avx(ZEXT416(in_stack_fffffffffffff5e8),in_stack_fffffffffffff5e8,1);
    auVar2 = vpinsrd_avx(auVar2,in_stack_fffffffffffff5e8,2);
    auVar2 = vpinsrd_avx(auVar2,in_stack_fffffffffffff5e8,3);
    auVar21._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    auVar21._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    local_260._16_8_ = auVar21._16_8_;
    local_260._24_8_ = auVar21._24_8_;
    local_720._16_8_ = local_260._16_8_;
    local_720._0_16_ = auVar21._0_16_;
    local_720._24_8_ = local_260._24_8_;
    local_49c = in_stack_fffffffffffff5e8;
    local_260 = auVar21;
    local_240 = in_stack_fffffffffffff5e8;
    local_23c = in_stack_fffffffffffff5e8;
    local_238 = in_stack_fffffffffffff5e8;
    local_234 = in_stack_fffffffffffff5e8;
    local_230 = in_stack_fffffffffffff5e8;
    local_22c = in_stack_fffffffffffff5e8;
    local_228 = in_stack_fffffffffffff5e8;
    local_224 = in_stack_fffffffffffff5e8;
  }
  local_724 = (short)conv_params * -4 + alpha * -4 + 0x10200;
  local_728 = beta * -4 + gamma * -4 + 0x10200;
  local_72c = 0x3f;
  local_72e = (short)(1 << (0xeU - (char)local_5f4 & 0x1f));
  local_730 = (short)(1 << (7U - (char)local_5f4 & 0x1f));
  local_400 = "";
  local_7c0[0] = '\0';
  local_7c0[1] = '\x02';
  local_7c0[2] = '\x02';
  local_7c0[3] = '\x04';
  local_7c0[4] = '\x04';
  local_7c0[5] = '\x06';
  local_7c0[6] = '\x06';
  local_7c0[7] = '\b';
  auStack_7b8[0] = '\x01';
  auStack_7b8[1] = '\x03';
  auStack_7b8[2] = '\x03';
  auStack_7b8[3] = '\x05';
  auStack_7b8[4] = '\x05';
  auStack_7b8[5] = '\a';
  auStack_7b8[6] = '\a';
  auStack_7b8[7] = '\t';
  auStack_7b0[0] = '\0';
  auStack_7b0[1] = '\x02';
  auStack_7b0[2] = '\x02';
  auStack_7b0[3] = '\x04';
  auStack_7b0[4] = '\x04';
  auStack_7b0[5] = '\x06';
  auStack_7b0[6] = '\x06';
  auStack_7b0[7] = '\b';
  auStack_7a8[0] = '\x01';
  auStack_7a8[1] = '\x03';
  auStack_7a8[2] = '\x03';
  auStack_7a8[3] = '\x05';
  auStack_7a8[4] = '\x05';
  auStack_7a8[5] = '\a';
  auStack_7a8[6] = '\a';
  auStack_7a8[7] = '\t';
  local_408 = "\x04\x06\x06\b\b\n\n\f\x05\a\a\t\t\v\v\r\x04\x06\x06\b\b\n\n\f\x05\a\a\t\t\v\v\r";
  local_7a0[0] = '\x04';
  local_7a0[1] = '\x06';
  local_7a0[2] = '\x06';
  local_7a0[3] = '\b';
  local_7a0[4] = '\b';
  local_7a0[5] = '\n';
  local_7a0[6] = '\n';
  local_7a0[7] = '\f';
  auStack_798[0] = '\x05';
  auStack_798[1] = '\a';
  auStack_798[2] = '\a';
  auStack_798[3] = '\t';
  auStack_798[4] = '\t';
  auStack_798[5] = '\v';
  auStack_798[6] = '\v';
  auStack_798[7] = '\r';
  auStack_790[0] = '\x04';
  auStack_790[1] = '\x06';
  auStack_790[2] = '\x06';
  auStack_790[3] = '\b';
  auStack_790[4] = '\b';
  auStack_790[5] = '\n';
  auStack_790[6] = '\n';
  auStack_790[7] = '\f';
  auStack_788[0] = '\x05';
  auStack_788[1] = '\a';
  auStack_788[2] = '\a';
  auStack_788[3] = '\t';
  auStack_788[4] = '\t';
  auStack_788[5] = '\v';
  auStack_788[6] = '\v';
  auStack_788[7] = '\r';
  local_410 = 
  "\x01\x03\x03\x05\x05\a\a\t\x02\x04\x04\x06\x06\b\b\n\x01\x03\x03\x05\x05\a\a\t\x02\x04\x04\x06\x06\b\b\n"
  ;
  local_780[0] = '\x01';
  local_780[1] = '\x03';
  local_780[2] = '\x03';
  local_780[3] = '\x05';
  local_780[4] = '\x05';
  local_780[5] = '\a';
  local_780[6] = '\a';
  local_780[7] = '\t';
  auStack_778[0] = '\x02';
  auStack_778[1] = '\x04';
  auStack_778[2] = '\x04';
  auStack_778[3] = '\x06';
  auStack_778[4] = '\x06';
  auStack_778[5] = '\b';
  auStack_778[6] = '\b';
  auStack_778[7] = '\n';
  auStack_770[0] = '\x01';
  auStack_770[1] = '\x03';
  auStack_770[2] = '\x03';
  auStack_770[3] = '\x05';
  auStack_770[4] = '\x05';
  auStack_770[5] = '\a';
  auStack_770[6] = '\a';
  auStack_770[7] = '\t';
  auStack_768[0] = '\x02';
  auStack_768[1] = '\x04';
  auStack_768[2] = '\x04';
  auStack_768[3] = '\x06';
  auStack_768[4] = '\x06';
  auStack_768[5] = '\b';
  auStack_768[6] = '\b';
  auStack_768[7] = '\n';
  local_418 = "\x05\a\a\t\t\v\v\r\x06\b\b\n\n\f\f\x0e\x05\a\a\t\t\v\v\r\x06\b\b\n\n\f\f\x0e";
  local_760[0] = '\x05';
  local_760[1] = '\a';
  local_760[2] = '\a';
  local_760[3] = '\t';
  local_760[4] = '\t';
  local_760[5] = '\v';
  local_760[6] = '\v';
  local_760[7] = '\r';
  auStack_758[0] = '\x06';
  auStack_758[1] = '\b';
  auStack_758[2] = '\b';
  auStack_758[3] = '\n';
  auStack_758[4] = '\n';
  auStack_758[5] = '\f';
  auStack_758[6] = '\f';
  auStack_758[7] = '\x0e';
  auStack_750[0] = '\x05';
  auStack_750[1] = '\a';
  auStack_750[2] = '\a';
  auStack_750[3] = '\t';
  auStack_750[4] = '\t';
  auStack_750[5] = '\v';
  auStack_750[6] = '\v';
  auStack_750[7] = '\r';
  auStack_748[0] = '\x06';
  auStack_748[1] = '\b';
  auStack_748[2] = '\b';
  auStack_748[3] = '\n';
  auStack_748[4] = '\n';
  auStack_748[5] = '\f';
  auStack_748[6] = '\f';
  auStack_748[7] = '\x0e';
  for (local_5e4 = 0; local_5e4 < p_width; local_5e4 = local_5e4 + 8) {
    for (local_5e8 = 0; local_5e8 < p_row; local_5e8 = local_5e8 + 8) {
      iVar14 = in_stack_00000008 + local_5e8 + 4 << ((byte)p_stride & 0x1f);
      iVar15 = p_col + local_5e4 + 4 << ((byte)subsampling_x & 0x1f);
      iVar16 = (int)((ulong)((long)local_4a8[2] * (long)iVar14 + (long)local_4a8[3] * (long)iVar15 +
                             (long)*local_4a8 >> ((byte)p_stride & 0x3f)) >> 0x10);
      iVar14 = (int)((ulong)((long)local_4a8[4] * (long)iVar14 + (long)local_4a8[5] * (long)iVar15 +
                             (long)local_4a8[1] >> ((byte)subsampling_x & 0x3f)) >> 0x10);
      if (iVar16 < -6) {
        local_800 = 0;
        local_5ec = -7;
        while( true ) {
          if (p_width - local_5e4 < 9) {
            in_stack_fffffffffffff5d8 = p_width - local_5e4;
          }
          else {
            in_stack_fffffffffffff5d8 = 8;
          }
          if (in_stack_fffffffffffff5d8 + -2 < local_5ec) break;
          in_stack_fffffffffffff5d0 = 0;
          iVar15 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
          in_stack_fffffffffffff5d4 =
               local_72e + (ushort)*(byte *)(local_4b0 + iVar15 * local_4bc) * local_730;
          auVar1 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5d4),(uint)in_stack_fffffffffffff5d4,1)
          ;
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,6);
          auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5d4,7);
          auVar2 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5d4),(uint)in_stack_fffffffffffff5d4,1)
          ;
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,6);
          auStack_1d0 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d4,7);
          uVar3 = auStack_1d0._0_8_;
          uVar4 = auStack_1d0._8_8_;
          local_484 = in_stack_fffffffffffff5d4;
          local_1e0 = auVar1;
          local_1c0 = in_stack_fffffffffffff5d4;
          local_1be = in_stack_fffffffffffff5d4;
          local_1bc = in_stack_fffffffffffff5d4;
          local_1ba = in_stack_fffffffffffff5d4;
          local_1b8 = in_stack_fffffffffffff5d4;
          local_1b6 = in_stack_fffffffffffff5d4;
          local_1b4 = in_stack_fffffffffffff5d4;
          local_1b2 = in_stack_fffffffffffff5d4;
          local_1b0 = in_stack_fffffffffffff5d4;
          local_1ae = in_stack_fffffffffffff5d4;
          local_1ac = in_stack_fffffffffffff5d4;
          local_1aa = in_stack_fffffffffffff5d4;
          local_1a8 = in_stack_fffffffffffff5d4;
          local_1a6 = in_stack_fffffffffffff5d4;
          local_1a4 = in_stack_fffffffffffff5d4;
          local_1a2 = in_stack_fffffffffffff5d4;
          iVar15 = clamp(iVar14 + 1 + local_5ec,in_stack_fffffffffffff5d0,local_4b8 + -1);
          in_stack_fffffffffffff5d6 =
               local_72e + (ushort)*(byte *)(local_4b0 + iVar15 * local_4bc) * local_730;
          auVar2 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5d6),(uint)in_stack_fffffffffffff5d6,1)
          ;
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,6);
          local_1a0 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,7);
          auVar2 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5d6),(uint)in_stack_fffffffffffff5d6,1)
          ;
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,6);
          auStack_190 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5d6,7);
          auVar8._16_8_ = uVar3;
          auVar8._0_16_ = auVar1;
          auVar8._24_8_ = uVar4;
          auVar7._16_8_ = auStack_190._0_8_;
          auVar7._0_16_ = local_1a0;
          auVar7._24_8_ = auStack_190._8_8_;
          auVar21 = vpblendd_avx2(auVar8,auVar7,0xf0);
          local_486 = in_stack_fffffffffffff5d6;
          local_180 = in_stack_fffffffffffff5d6;
          local_17e = in_stack_fffffffffffff5d6;
          local_17c = in_stack_fffffffffffff5d6;
          local_17a = in_stack_fffffffffffff5d6;
          local_178 = in_stack_fffffffffffff5d6;
          local_176 = in_stack_fffffffffffff5d6;
          local_174 = in_stack_fffffffffffff5d6;
          local_172 = in_stack_fffffffffffff5d6;
          local_170 = in_stack_fffffffffffff5d6;
          local_16e = in_stack_fffffffffffff5d6;
          local_16c = in_stack_fffffffffffff5d6;
          local_16a = in_stack_fffffffffffff5d6;
          local_168 = in_stack_fffffffffffff5d6;
          local_166 = in_stack_fffffffffffff5d6;
          local_164 = in_stack_fffffffffffff5d6;
          local_162 = in_stack_fffffffffffff5d6;
          *(undefined1 (*) [32])(local_5e0 + (long)local_800 * 4) = auVar21;
          local_800 = local_800 + 1;
          local_5ec = local_5ec + 2;
        }
        in_stack_fffffffffffff5dc = local_5ec;
        iVar14 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
        in_stack_fffffffffffff5ce =
             local_72e + (ushort)*(byte *)(local_4b0 + iVar14 * local_4bc) * local_730;
        auVar1 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5ce),(uint)in_stack_fffffffffffff5ce,1);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,2);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,4);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,5);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,6);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ce,7);
        auVar2 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5ce),(uint)in_stack_fffffffffffff5ce,1);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,2);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,3);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,4);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,5);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,6);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ce,7);
        auVar22._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
        auVar22._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
        local_160._0_8_ = auVar22._0_8_;
        local_160._8_8_ = auVar22._8_8_;
        uVar3 = local_160._8_8_;
        local_160._16_8_ = auVar22._16_8_;
        uVar4 = local_160._16_8_;
        local_160._24_8_ = auVar22._24_8_;
        uVar11 = local_160._24_8_;
        lVar19 = (long)local_800;
        local_488 = in_stack_fffffffffffff5ce;
        local_140 = in_stack_fffffffffffff5ce;
        local_13e = in_stack_fffffffffffff5ce;
        local_13c = in_stack_fffffffffffff5ce;
        local_13a = in_stack_fffffffffffff5ce;
        local_138 = in_stack_fffffffffffff5ce;
        local_136 = in_stack_fffffffffffff5ce;
        local_134 = in_stack_fffffffffffff5ce;
        local_132 = in_stack_fffffffffffff5ce;
        local_130 = in_stack_fffffffffffff5ce;
        local_12e = in_stack_fffffffffffff5ce;
        local_12c = in_stack_fffffffffffff5ce;
        local_12a = in_stack_fffffffffffff5ce;
        local_128 = in_stack_fffffffffffff5ce;
        local_126 = in_stack_fffffffffffff5ce;
        local_124 = in_stack_fffffffffffff5ce;
        local_122 = in_stack_fffffffffffff5ce;
        local_5e0[lVar19 * 4] = local_160._0_8_;
        local_160 = auVar22;
        local_5e0[lVar19 * 4 + 1] = uVar3;
        local_5e0[lVar19 * 4 + 2] = uVar4;
        local_5e0[lVar19 * 4 + 3] = uVar11;
      }
      else if (iVar16 < local_4b4 + 6) {
        if ((iVar16 + -7 < 0) || (local_4b4 < iVar16 + 9)) {
          iVar15 = -(iVar16 + -6);
          iVar17 = (iVar16 + 8) - local_4b4;
          local_5ec = -7;
          while( true ) {
            if (p_width - local_5e4 < 9) {
              iVar25 = p_width - local_5e4;
            }
            else {
              iVar25 = 8;
            }
            if (iVar25 + -2 < local_5ec) break;
            iVar25 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
            lVar19 = local_4b0 + iVar25 * local_4bc + (long)iVar16;
            local_3c8 = (undefined1 (*) [16])(lVar19 + -7);
            uVar3 = *(undefined8 *)*local_3c8;
            uVar4 = *(undefined8 *)(lVar19 + 1);
            auVar1 = *local_3c8;
            local_8d0 = *local_3c8;
            iVar25 = clamp(iVar14 + local_5ec + 1,0,local_4b8 + -1);
            lVar19 = local_4b0 + iVar25 * local_4bc + (long)iVar16;
            local_3d0 = (undefined1 (*) [16])(lVar19 + -7);
            local_8e0 = *local_3d0;
            if (-1 < iVar15) {
              local_3d8 = warp_pad_left + iVar15;
              local_340 = *(undefined8 *)*local_3d8;
              uStack_338 = *(undefined8 *)(warp_pad_left[iVar15] + 8);
              local_8d0 = vpshufb_avx(auVar1,(undefined1  [16])*local_3d8);
              local_8e0 = vpshufb_avx(*local_3d0,(undefined1  [16])*local_3d8);
              local_330 = *(undefined8 *)*local_3d0;
              uStack_328 = *(undefined8 *)(lVar19 + 1);
              local_320 = local_340;
              uStack_318 = uStack_338;
              local_310 = uVar3;
              uStack_308 = uVar4;
            }
            if (-1 < iVar17) {
              local_3e0 = warp_pad_right + iVar17;
              local_380 = *(undefined8 *)*local_3e0;
              uStack_378 = *(undefined8 *)(warp_pad_right[iVar17] + 8);
              local_350 = local_8d0._0_8_;
              uStack_348 = local_8d0._8_8_;
              local_8d0 = vpshufb_avx(local_8d0,(undefined1  [16])*local_3e0);
              local_370 = local_8e0._0_8_;
              uStack_368 = local_8e0._8_8_;
              local_8e0 = vpshufb_avx(local_8e0,(undefined1  [16])*local_3e0);
              local_360 = local_380;
              uStack_358 = uStack_378;
            }
            local_2f0 = local_8d0._0_8_;
            uStack_2e8 = local_8d0._8_8_;
            auVar24._0_16_ = ZEXT116(0) * local_8e0 + ZEXT116(1) * local_8d0;
            auVar24._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * local_8e0
            ;
            in_stack_fffffffffffff6e0 = auVar24._0_24_;
            src_02[0]._4_4_ = in_stack_fffffffffffff5dc;
            src_02[0]._0_4_ = in_stack_fffffffffffff5d8;
            src_02[1]._0_4_ = in_stack_fffffffffffff5e0;
            src_02[1]._4_4_ = in_stack_fffffffffffff5e4;
            src_02[2]._0_4_ = in_stack_fffffffffffff5e8;
            src_02[2]._4_4_ = uVar18;
            src_02[3]._0_4_ = uVar27;
            src_02[3]._4_4_ = uVar20;
            horizontal_filter_avx2
                      (src_02,(__m256i *)
                              CONCAT26(in_stack_fffffffffffff5d6,
                                       CONCAT24(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0)
                                      ),
                       CONCAT22(in_stack_fffffffffffff5ce,in_stack_fffffffffffff5cc),
                       in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0
                       ,(__m256i *)
                        CONCAT44(in_stack_fffffffffffff5bc,
                                 CONCAT22(in_stack_fffffffffffff5ba,in_stack_fffffffffffff5b8)),
                       (__m256i *)local_690,
                       (__m128i *)CONCAT44(in_stack_fffffffffffff554,in_stack_fffffffffffff550));
            local_5ec = local_5ec + 2;
          }
          iVar14 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
          lVar19 = local_4b0 + iVar14 * local_4bc + (long)iVar16;
          local_3e8 = (undefined1 (*) [16])(lVar19 + -7);
          lVar30 = *(longlong *)(lVar19 + 1);
          palVar28 = *(__m256i **)*local_3e8;
          lVar29 = lVar30;
          if (-1 < iVar15) {
            local_3f0 = warp_pad_left + iVar15;
            in_stack_fffffffffffff6c0 = *(__m256i **)*local_3f0;
            in_stack_fffffffffffff6c8 = *(__m256i **)(warp_pad_left[iVar15] + 8);
            auVar1 = vpshufb_avx(*local_3e8,(undefined1  [16])*local_3f0);
            palVar28 = auVar1._0_8_;
            lVar29 = auVar1._8_8_;
            local_3a0 = in_stack_fffffffffffff6c0;
            palStack_398 = in_stack_fffffffffffff6c8;
            local_390 = *(__m256i **)*local_3e8;
            lStack_388 = lVar30;
          }
          horz_out_00 = palVar28;
          lVar30 = lVar29;
          if (-1 < iVar17) {
            local_3f8 = warp_pad_right + iVar17;
            in_stack_fffffffffffff6b0 = *(__m128i **)*local_3f8;
            in_stack_fffffffffffff6b8 = *(__m256i **)(warp_pad_right[iVar17] + 8);
            auVar1._8_8_ = lVar29;
            auVar1._0_8_ = palVar28;
            auVar1 = vpshufb_avx(auVar1,(undefined1  [16])*local_3f8);
            horz_out_00 = auVar1._0_8_;
            lVar30 = auVar1._8_8_;
            local_3c0 = in_stack_fffffffffffff6b0;
            palStack_3b8 = in_stack_fffffffffffff6b8;
            local_3b0 = palVar28;
            lStack_3a8 = lVar29;
          }
          local_300 = horz_out_00;
          lStack_2f8 = lVar30;
          prepare_horizontal_filter_coeff
                    (in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0,
                     (__m256i *)
                     CONCAT44(in_stack_fffffffffffff5bc,
                              CONCAT22(in_stack_fffffffffffff5ba,in_stack_fffffffffffff5b8)));
          src_03[1] = in_stack_fffffffffffff6e0._0_8_;
          src_03[2] = in_stack_fffffffffffff6e0._8_8_;
          src_03[3] = in_stack_fffffffffffff6e0._16_8_;
          src_03[0] = lVar30;
          filter_src_pixels_avx2
                    (src_03,horz_out_00,in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,
                     in_stack_fffffffffffff6b8,in_stack_fffffffffffff6b0,in_stack_fffffffffffff6ac);
        }
        else {
          prepare_warp_horizontal_filter_avx2
                    (in_stack_fffffffffffff590,in_stack_fffffffffffff588,
                     (int)((ulong)in_stack_fffffffffffff580 >> 0x20),
                     (int32_t)in_stack_fffffffffffff580,(int32_t)((ulong)local_7c0 >> 0x20),
                     (int32_t)local_7c0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5d0,
                     in_stack_fffffffffffff5d8,in_stack_fffffffffffff5e0,in_stack_fffffffffffff5e8,
                     (__m256i *)CONCAT44(uVar20,uVar27),
                     (__m128i *)CONCAT44(iVar13,CONCAT22(uVar12,in_stack_fffffffffffff5f8)),
                     in_stack_fffffffffffff600);
        }
      }
      else {
        local_848 = 0;
        local_5ec = -7;
        while( true ) {
          if (p_width - local_5e4 < 9) {
            in_stack_fffffffffffff5c4 = p_width - local_5e4;
          }
          else {
            in_stack_fffffffffffff5c4 = 8;
          }
          if (in_stack_fffffffffffff5c4 + -2 < local_5ec) break;
          in_stack_fffffffffffff5bc = 0;
          iVar15 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
          local_48a = local_72e +
                      (ushort)*(byte *)(local_4b0 + (local_4b4 + -1 + iVar15 * local_4bc)) *
                      local_730;
          auVar1 = vpinsrw_avx(ZEXT216(local_48a),(uint)local_48a,1);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,2);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,3);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,4);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,5);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,6);
          auVar1 = vpinsrw_avx(auVar1,(uint)local_48a,7);
          auVar2 = vpinsrw_avx(ZEXT216(local_48a),(uint)local_48a,1);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48a,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48a,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48a,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48a,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48a,6);
          auStack_110 = vpinsrw_avx(auVar2,(uint)local_48a,7);
          uVar3 = auStack_110._0_8_;
          uVar4 = auStack_110._8_8_;
          local_120 = auVar1;
          local_100 = local_48a;
          local_fe = local_48a;
          local_fc = local_48a;
          local_fa = local_48a;
          local_f8 = local_48a;
          local_f6 = local_48a;
          local_f4 = local_48a;
          local_f2 = local_48a;
          local_f0 = local_48a;
          local_ee = local_48a;
          local_ec = local_48a;
          local_ea = local_48a;
          local_e8 = local_48a;
          local_e6 = local_48a;
          local_e4 = local_48a;
          local_e2 = local_48a;
          uVar26 = local_48a;
          iVar15 = clamp(iVar14 + 1 + local_5ec,in_stack_fffffffffffff5bc,local_4b8 + -1);
          local_48c = local_72e +
                      (ushort)*(byte *)(local_4b0 + (local_4b4 + -1 + iVar15 * local_4bc)) *
                      local_730;
          in_stack_fffffffffffff5c0 = CONCAT22(local_48c,uVar26);
          auVar2 = vpinsrw_avx(ZEXT216(local_48c),(uint)local_48c,1);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,6);
          local_e0 = vpinsrw_avx(auVar2,(uint)local_48c,7);
          auVar2 = vpinsrw_avx(ZEXT216(local_48c),(uint)local_48c,1);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,2);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,3);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,4);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,5);
          auVar2 = vpinsrw_avx(auVar2,(uint)local_48c,6);
          auStack_d0 = vpinsrw_avx(auVar2,(uint)local_48c,7);
          auVar6._16_8_ = uVar3;
          auVar6._0_16_ = auVar1;
          auVar6._24_8_ = uVar4;
          auVar5._16_8_ = auStack_d0._0_8_;
          auVar5._0_16_ = local_e0;
          auVar5._24_8_ = auStack_d0._8_8_;
          auVar21 = vpblendd_avx2(auVar6,auVar5,0xf0);
          local_c0 = local_48c;
          local_be = local_48c;
          local_bc = local_48c;
          local_ba = local_48c;
          local_b8 = local_48c;
          local_b6 = local_48c;
          local_b4 = local_48c;
          local_b2 = local_48c;
          local_b0 = local_48c;
          local_ae = local_48c;
          local_ac = local_48c;
          local_aa = local_48c;
          local_a8 = local_48c;
          local_a6 = local_48c;
          local_a4 = local_48c;
          local_a2 = local_48c;
          *(undefined1 (*) [32])(local_5e0 + (long)local_848 * 4) = auVar21;
          local_848 = local_848 + 1;
          local_5ec = local_5ec + 2;
        }
        in_stack_fffffffffffff5c8 = local_5ec;
        iVar14 = clamp(iVar14 + local_5ec,0,local_4b8 + -1);
        in_stack_fffffffffffff5ba =
             local_72e +
             (ushort)*(byte *)(local_4b0 + (local_4b4 + -1 + iVar14 * local_4bc)) * local_730;
        auVar1 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5ba),(uint)in_stack_fffffffffffff5ba,1);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,2);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,3);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,4);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,5);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,6);
        auVar1 = vpinsrw_avx(auVar1,(uint)in_stack_fffffffffffff5ba,7);
        auVar2 = vpinsrw_avx(ZEXT216(in_stack_fffffffffffff5ba),(uint)in_stack_fffffffffffff5ba,1);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,2);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,3);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,4);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,5);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,6);
        auVar2 = vpinsrw_avx(auVar2,(uint)in_stack_fffffffffffff5ba,7);
        auVar23._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
        auVar23._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
        local_a0._0_8_ = auVar23._0_8_;
        local_a0._8_8_ = auVar23._8_8_;
        uVar3 = local_a0._8_8_;
        local_a0._16_8_ = auVar23._16_8_;
        uVar4 = local_a0._16_8_;
        local_a0._24_8_ = auVar23._24_8_;
        uVar11 = local_a0._24_8_;
        lVar19 = (long)local_848;
        local_48e = in_stack_fffffffffffff5ba;
        local_78 = in_stack_fffffffffffff5ba;
        local_76 = in_stack_fffffffffffff5ba;
        local_74 = in_stack_fffffffffffff5ba;
        local_72 = in_stack_fffffffffffff5ba;
        local_70 = in_stack_fffffffffffff5ba;
        local_6e = in_stack_fffffffffffff5ba;
        local_6c = in_stack_fffffffffffff5ba;
        local_6a = in_stack_fffffffffffff5ba;
        local_68 = in_stack_fffffffffffff5ba;
        local_66 = in_stack_fffffffffffff5ba;
        local_64 = in_stack_fffffffffffff5ba;
        local_62 = in_stack_fffffffffffff5ba;
        local_60 = in_stack_fffffffffffff5ba;
        local_5e = in_stack_fffffffffffff5ba;
        local_5c = in_stack_fffffffffffff5ba;
        local_5a = in_stack_fffffffffffff5ba;
        local_5e0[lVar19 * 4] = local_a0._0_8_;
        local_a0 = auVar23;
        local_5e0[lVar19 * 4 + 1] = uVar3;
        local_5e0[lVar19 * 4 + 2] = uVar4;
        local_5e0[lVar19 * 4 + 3] = uVar11;
      }
      in_stack_fffffffffffff580 = local_6c0;
      in_stack_fffffffffffff588 = &local_6e0;
      in_stack_fffffffffffff590 = local_700;
      in_stack_fffffffffffff550 = local_5e4;
      prepare_warp_vertical_filter_avx2
                ((uint8_t *)CONCAT44(uVar18,in_stack_fffffffffffff5e8),
                 (__m256i *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),
                 (ConvolveParams *)CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                 in_stack_fffffffffffff5d6,in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0,
                 in_stack_fffffffffffff628,in_stack_fffffffffffff630,in_stack_fffffffffffff638,
                 in_stack_fffffffffffff640,in_stack_fffffffffffff648,in_stack_fffffffffffff650,
                 in_stack_fffffffffffff658,in_stack_fffffffffffff660,in_stack_fffffffffffff668,
                 in_stack_fffffffffffff670,in_stack_fffffffffffff678);
    }
  }
  return;
}

Assistant:

void av1_warp_affine_avx2(const int32_t *mat, const uint8_t *ref, int width,
                          int height, int stride, uint8_t *pred, int p_col,
                          int p_row, int p_width, int p_height, int p_stride,
                          int subsampling_x, int subsampling_y,
                          ConvolveParams *conv_params, int16_t alpha,
                          int16_t beta, int16_t gamma, int16_t delta) {
  __m256i horz_out[8];
  int i, j, k;
  const int bd = 8;
  const int reduce_bits_horiz = conv_params->round_0;
  const int reduce_bits_vert = conv_params->is_compound
                                   ? conv_params->round_1
                                   : 2 * FILTER_BITS - reduce_bits_horiz;
  const int offset_bits_horiz = bd + FILTER_BITS - 1;
  assert(IMPLIES(conv_params->is_compound, conv_params->dst != NULL));

  const int offset_bits_vert = bd + 2 * FILTER_BITS - reduce_bits_horiz;
  const __m256i reduce_bits_vert_const =
      _mm256_set1_epi32(((1 << reduce_bits_vert) >> 1));
  const __m256i res_add_const = _mm256_set1_epi32(1 << offset_bits_vert);
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  assert(IMPLIES(conv_params->do_average, conv_params->is_compound));

  const __m256i round_const = _mm256_set1_epi16(
      (1 << offset_bits_horiz) + ((1 << reduce_bits_horiz) >> 1));
  const __m128i shift = _mm_cvtsi32_si128(reduce_bits_horiz);

  __m256i res_sub_const, round_bits_const, wt;
  unpack_weights_and_set_round_const_avx2(conv_params, round_bits, offset_bits,
                                          &res_sub_const, &round_bits_const,
                                          &wt);

  __m256i res_add_const_1;
  if (conv_params->is_compound == 1) {
    res_add_const_1 = _mm256_add_epi32(reduce_bits_vert_const, res_add_const);
  } else {
    res_add_const_1 = _mm256_set1_epi32(-(1 << (bd + reduce_bits_vert - 1)) +
                                        ((1 << reduce_bits_vert) >> 1));
  }
  const int32_t const1 = alpha * (-4) + beta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const2 = gamma * (-4) + delta * (-4) +
                         (1 << (WARPEDDIFF_PREC_BITS - 1)) +
                         (WARPEDPIXEL_PREC_SHIFTS << WARPEDDIFF_PREC_BITS);
  const int32_t const3 = ((1 << WARP_PARAM_REDUCE_BITS) - 1);
  const int16_t const4 = (1 << (bd + FILTER_BITS - reduce_bits_horiz - 1));
  const int16_t const5 = (1 << (FILTER_BITS - reduce_bits_horiz));

  __m256i shuffle_src[4];
  shuffle_src[0] = _mm256_load_si256((__m256i *)shuffle_src0);
  shuffle_src[1] = _mm256_load_si256((__m256i *)shuffle_src1);
  shuffle_src[2] = _mm256_load_si256((__m256i *)shuffle_src2);
  shuffle_src[3] = _mm256_load_si256((__m256i *)shuffle_src3);

  for (i = 0; i < p_height; i += 8) {
    for (j = 0; j < p_width; j += 8) {
      const int32_t src_x = (p_col + j + 4) << subsampling_x;
      const int32_t src_y = (p_row + i + 4) << subsampling_y;
      const int64_t dst_x =
          (int64_t)mat[2] * src_x + (int64_t)mat[3] * src_y + (int64_t)mat[0];
      const int64_t dst_y =
          (int64_t)mat[4] * src_x + (int64_t)mat[5] * src_y + (int64_t)mat[1];
      const int64_t x4 = dst_x >> subsampling_x;
      const int64_t y4 = dst_y >> subsampling_y;

      int32_t ix4 = (int32_t)(x4 >> WARPEDMODEL_PREC_BITS);
      int32_t sx4 = x4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);
      int32_t iy4 = (int32_t)(y4 >> WARPEDMODEL_PREC_BITS);
      int32_t sy4 = y4 & ((1 << WARPEDMODEL_PREC_BITS) - 1);

      // Add in all the constant terms, including rounding and offset
      sx4 += const1;
      sy4 += const2;

      sx4 &= ~const3;
      sy4 &= ~const3;

      // Horizontal filter
      // If the block is aligned such that, after clamping, every sample
      // would be taken from the leftmost/rightmost column, then we can
      // skip the expensive horizontal filter.

      if (ix4 <= -7) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 =
              _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] = _mm256_set1_epi16(const4 + ref[iy * stride] * const5);
      } else if (ix4 >= width + 6) {
        int iy, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_0 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          const __m256i temp_1 = _mm256_set1_epi16(
              const4 + ref[iy * stride + (width - 1)] * const5);
          horz_out[row] = _mm256_blend_epi32(temp_0, temp_1, 0xf0);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        horz_out[row] =
            _mm256_set1_epi16(const4 + ref[iy * stride + (width - 1)] * const5);
      } else if (((ix4 - 7) < 0) || ((ix4 + 9) > width)) {
        const int out_of_boundary_left = -(ix4 - 6);
        const int out_of_boundary_right = (ix4 + 8) - width;
        int iy, sx, row = 0;
        for (k = -7; k <= (AOMMIN(8, p_height - i) - 2); k += 2) {
          iy = iy4 + k;
          iy = clamp(iy, 0, height - 1);
          __m128i src0 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
          iy = iy4 + k + 1;
          iy = clamp(iy, 0, height - 1);
          __m128i src1 =
              _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));

          if (out_of_boundary_left >= 0) {
            const __m128i shuffle_reg_left =
                _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_left);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_left);
          }
          if (out_of_boundary_right >= 0) {
            const __m128i shuffle_reg_right = _mm_loadu_si128(
                (__m128i *)warp_pad_right[out_of_boundary_right]);
            src0 = _mm_shuffle_epi8(src0, shuffle_reg_right);
            src1 = _mm_shuffle_epi8(src1, shuffle_reg_right);
          }
          sx = sx4 + beta * (k + 4);
          const __m256i src_01 =
              _mm256_inserti128_si256(_mm256_castsi128_si256(src0), src1, 0x1);
          horizontal_filter_avx2(src_01, horz_out, sx, alpha, beta, row,
                                 shuffle_src, &round_const, &shift);
          row += 1;
        }
        iy = iy4 + k;
        iy = clamp(iy, 0, height - 1);
        __m128i src = _mm_loadu_si128((__m128i *)(ref + iy * stride + ix4 - 7));
        if (out_of_boundary_left >= 0) {
          const __m128i shuffle_reg_left =
              _mm_loadu_si128((__m128i *)warp_pad_left[out_of_boundary_left]);
          src = _mm_shuffle_epi8(src, shuffle_reg_left);
        }
        if (out_of_boundary_right >= 0) {
          const __m128i shuffle_reg_right =
              _mm_loadu_si128((__m128i *)warp_pad_right[out_of_boundary_right]);
          src = _mm_shuffle_epi8(src, shuffle_reg_right);
        }
        sx = sx4 + beta * (k + 4);
        const __m256i src_01 = _mm256_castsi128_si256(src);
        __m256i coeff[4];
        prepare_horizontal_filter_coeff(alpha, sx, coeff);
        filter_src_pixels_avx2(src_01, horz_out, coeff, shuffle_src,
                               &round_const, &shift, row);
      } else {
        prepare_warp_horizontal_filter_avx2(
            ref, horz_out, stride, ix4, iy4, sx4, alpha, beta, p_height, height,
            i, &round_const, &shift, shuffle_src);
      }

      // Vertical filter
      prepare_warp_vertical_filter_avx2(
          pred, horz_out, conv_params, gamma, delta, p_height, p_stride,
          p_width, i, j, sy4, reduce_bits_vert, &res_add_const_1, round_bits,
          &res_sub_const, &round_bits_const, &wt);
    }
  }
}